

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O3

void test_cipher_caesar_parse_key(void)

{
  byte bVar1;
  char text4 [3];
  char text3 [3];
  char text2 [3];
  uint key;
  char text [13];
  undefined2 local_40;
  undefined1 local_3e;
  undefined2 local_3c;
  undefined1 local_3a;
  undefined2 local_38;
  undefined1 local_36;
  uint local_34;
  undefined5 local_30;
  undefined3 uStack_2b;
  undefined5 uStack_28;
  
  uStack_28 = 0x2179656b;
  local_30 = 0x6c61766e49;
  uStack_2b = 0x206469;
  local_36 = 0;
  local_38 = 0x3231;
  local_3a = 0;
  local_3c = 0x3632;
  local_3e = 0;
  local_40 = 0x3732;
  local_34 = 0;
  bVar1 = caesar_parse_key(&local_30,&local_34);
  UnityAssertEqualNumber(0,(ulong)bVar1,(char *)0x0,0x65,UNITY_DISPLAY_STYLE_INT);
  bVar1 = caesar_parse_key(&local_38,&local_34);
  UnityAssertEqualNumber(1,(ulong)bVar1,(char *)0x0,0x68,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(0xc,(ulong)local_34,(char *)0x0,0x69,UNITY_DISPLAY_STYLE_UINT);
  bVar1 = caesar_parse_key(&local_3c,&local_34);
  UnityAssertEqualNumber(1,(ulong)bVar1,(char *)0x0,0x6c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(0x1a,(ulong)local_34,(char *)0x0,0x6d,UNITY_DISPLAY_STYLE_UINT);
  bVar1 = caesar_parse_key(&local_40,&local_34);
  UnityAssertEqualNumber(0,(ulong)bVar1,(char *)0x0,0x6f,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

void test_cipher_caesar_parse_key(void)
{
	char text[] = "Invalid key!";
	char text2[] = "12";
	char text3[] = "26";
	char text4[] = "27";

	unsigned int key = 0;
	bool success;

	TEST_ASSERT_EQUAL_INT(false, caesar_parse_key(text, &key));

	success = caesar_parse_key(text2, &key);
	TEST_ASSERT_EQUAL_INT(true, success);
	TEST_ASSERT_EQUAL_UINT(12, key);

	success = caesar_parse_key(text3, &key);
	TEST_ASSERT_EQUAL_INT(true, success);
	TEST_ASSERT_EQUAL_UINT(26, key);

	TEST_ASSERT_EQUAL_INT(false, caesar_parse_key(text4, &key));
}